

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dark.h
# Opt level: O2

string * __thiscall
bandit::colorizer::dark::bad_abi_cxx11_(string *__return_storage_ptr__,dark *this)

{
  backend::dark_red_abi_cxx11_(__return_storage_ptr__,(backend *)this);
  return __return_storage_ptr__;
}

Assistant:

const std::string bad() const override {
        return dark_red();
      }